

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
* __thiscall
kj::_::
NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
::operator=(NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
            *this,NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
                  *other)

{
  Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults> *params;
  NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
  *other_local;
  NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>_>
  *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>>
                (&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>>
                         (&(other->field_1).value);
      ctor<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>,capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }